

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

int __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::open
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,char *__file,int __oflag,...)

{
  pointer *pppDVar1;
  char *pcVar2;
  pointer *pppVar3;
  char cVar4;
  iterator iVar5;
  pointer ppDVar6;
  pointer ppVar7;
  iterator __position;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  Dictionary *this_00;
  ostream *poVar14;
  char *pcVar15;
  undefined8 *puVar16;
  size_t sVar17;
  char *pcVar18;
  Dictionary *pDVar19;
  mecab_dictionary_info_t *pmVar20;
  size_t sVar21;
  unsigned_long uVar22;
  unsigned_long uVar23;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  whatlog *pwVar24;
  undefined8 *puVar25;
  char *pcVar26;
  ulong uVar27;
  char *pcVar28;
  long lVar29;
  char *pcVar30;
  long lVar31;
  result_type rVar32;
  string tmp;
  Dictionary *sysdic;
  string userdic;
  string prefix;
  undefined1 local_c8 [32];
  Param *local_a8;
  Dictionary *local_a0;
  char *local_98;
  long local_90;
  CharProperty *local_88;
  string local_80;
  vector<MeCab::Dictionary*,std::allocator<MeCab::Dictionary*>> *local_60;
  Dictionary *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  close(this,(int)__file);
  local_a8 = (Param *)__file;
  Param::get<std::__cxx11::string>(&local_50,(Param *)__file,"dicdir");
  pDVar19 = (Dictionary *)(local_c8 + 0x10);
  local_c8._0_8_ = pDVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"unk.dic","");
  create_filename(&local_80,&local_50,(string *)local_c8);
  local_58 = &this->unkdic_;
  iVar11 = Dictionary::open(local_58,local_80._M_dataplus._M_p,0x15cd2b);
  iVar12 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
    iVar12 = extraout_EDX_00;
  }
  if ((Dictionary *)local_c8._0_8_ != pDVar19) {
    operator_delete((void *)local_c8._0_8_);
    iVar12 = extraout_EDX_01;
  }
  if ((char)iVar11 == '\0') {
    pwVar24 = &this->what_;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pwVar24,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar24,"(",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)pwVar24,0x67);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"unkdic_.open(create_filename (prefix, UNK_DIC_FILE).c_str())",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
    pcVar15 = whatlog::str(&(this->unkdic_).what_);
    if (pcVar15 == (char *)0x0) {
      std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
    }
    else {
      sVar17 = strlen(pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar15,sVar17);
    }
  }
  else {
    local_88 = &this->property_;
    iVar12 = CharProperty::open(local_88,(char *)local_a8,iVar12);
    if ((char)iVar12 == '\0') {
      pwVar24 = &this->what_;
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pwVar24,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar24,"(",1);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)pwVar24,0x69);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"property_.open(param)",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
      pcVar15 = whatlog::str(&(this->property_).what_);
      if (pcVar15 == (char *)0x0) {
        std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
      }
      else {
        sVar17 = strlen(pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar15,sVar17);
      }
    }
    else {
      this_00 = (Dictionary *)operator_new(0x260);
      Dictionary::Dictionary(this_00);
      local_c8._0_8_ = pDVar19;
      local_a0 = this_00;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"sys.dic","");
      create_filename(&local_80,&local_50,(string *)local_c8);
      iVar12 = Dictionary::open(this_00,local_80._M_dataplus._M_p,0x15cd2b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((Dictionary *)local_c8._0_8_ != pDVar19) {
        operator_delete((void *)local_c8._0_8_);
      }
      if ((char)iVar12 == '\0') {
        pwVar24 = &this->what_;
        std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pwVar24,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                   ,0x6f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar24,"(",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)pwVar24,0x6e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"sysdic->open (create_filename(prefix, SYS_DIC_FILE).c_str())",0x3c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
        pcVar15 = whatlog::str(&local_a0->what_);
        if (pcVar15 == (char *)0x0) {
          std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
        }
        else {
          sVar17 = strlen(pcVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar15,sVar17);
        }
      }
      else {
        if (local_a0->type_ == 0) {
          CharProperty::set_charset(local_88,local_a0->charset_);
          local_60 = (vector<MeCab::Dictionary*,std::allocator<MeCab::Dictionary*>> *)&this->dic_;
          iVar5._M_current =
               (this->dic_).
               super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->dic_).
              super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<MeCab::Dictionary*,std::allocator<MeCab::Dictionary*>>::
            _M_realloc_insert<MeCab::Dictionary*const&>(local_60,iVar5,&local_a0);
          }
          else {
            *iVar5._M_current = local_a0;
            pppDVar1 = &(this->dic_).
                        super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppDVar1 = *pppDVar1 + 1;
          }
          Param::get<std::__cxx11::string>(&local_80,local_a8,"userdic");
          if (local_80._M_string_length != 0) {
            pcVar15 = (char *)operator_new__(0x2000);
            puVar16 = (undefined8 *)operator_new__(0x10000);
            strncpy(pcVar15,local_80._M_dataplus._M_p,0x2000);
            sVar17 = strlen(pcVar15);
            if (0 < (long)sVar17) {
              pcVar26 = pcVar15 + sVar17;
              local_90 = 0;
              pcVar28 = pcVar15;
              local_98 = pcVar15;
              uVar27 = 0x2000;
              puVar25 = puVar16;
              do {
                for (; (cVar4 = *pcVar28, cVar4 == '\t' || (cVar4 == ' ')); pcVar28 = pcVar28 + 1) {
                }
                if (cVar4 == '\"') {
                  pcVar28 = pcVar28 + 1;
                  pcVar30 = pcVar28;
                  for (pcVar15 = pcVar28;
                      (pcVar18 = pcVar15, pcVar15 < pcVar26 &&
                      ((cVar4 = *pcVar15, cVar4 != '\"' ||
                       (pcVar18 = pcVar15 + 1, pcVar2 = pcVar15 + 1, pcVar15 = pcVar18,
                       *pcVar2 == '\"')))); pcVar15 = pcVar15 + 1) {
                    *pcVar30 = cVar4;
                    pcVar30 = pcVar30 + 1;
                  }
                  local_c8[0] = 0x2c;
                  pcVar18 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                      (pcVar18,pcVar26,local_c8);
                }
                else {
                  local_c8[0] = 0x2c;
                  pcVar18 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                      (pcVar28,pcVar26,local_c8);
                  pcVar30 = pcVar18;
                }
                lVar31 = local_90;
                pcVar15 = local_98;
                if (uVar27 < 2) {
                  *puVar25 = pcVar28;
                  if (uVar27 - 1 == 0) break;
                }
                else {
                  *pcVar30 = '\0';
                  *puVar25 = pcVar28;
                }
                local_90 = local_90 + 1;
                puVar25 = puVar25 + 1;
                pcVar28 = pcVar18 + 1;
                uVar27 = uVar27 - 1;
              } while (pcVar28 < pcVar26);
              local_90 = lVar31 + 1;
              lVar31 = local_90;
              if (local_90 != 0) {
                lVar29 = 0;
                do {
                  pDVar19 = (Dictionary *)operator_new(0x260);
                  Dictionary::Dictionary(pDVar19);
                  local_c8._0_8_ = pDVar19;
                  iVar12 = Dictionary::open(pDVar19,(char *)puVar16[lVar29],0x15cd2b);
                  if ((char)iVar12 == '\0') {
                    pwVar24 = &this->what_;
                    std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) +
                                    (int)pwVar24);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pwVar24,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                               ,0x6f);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar24,"(",1);
                    poVar14 = (ostream *)std::ostream::operator<<((ostream *)pwVar24,0x7f);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"d->open(dicfile[i])",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
                    pcVar28 = whatlog::str((whatlog *)(local_c8._0_8_ + 0x68));
                    if (pcVar28 == (char *)0x0) {
                      std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18))
                      ;
                    }
                    else {
                      sVar17 = strlen(pcVar28);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar28,sVar17);
                    }
LAB_00127ba3:
                    operator_delete__(puVar16);
                    operator_delete__(pcVar15);
                    goto LAB_00127bb5;
                  }
                  if (*(uint *)(local_c8._0_8_ + 0x34) != 1) {
                    pwVar24 = &this->what_;
                    std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) +
                                    (int)pwVar24);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pwVar24,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                               ,0x6f);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar24,"(",1);
                    poVar14 = (ostream *)std::ostream::operator<<((ostream *)pwVar24,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"d->type() == 1",0xe)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"not a user dictionary: ",0x17);
                    pcVar28 = (char *)puVar16[lVar29];
                    if (pcVar28 == (char *)0x0) {
                      std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18))
                      ;
                    }
                    else {
                      sVar17 = strlen(pcVar28);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar28,sVar17);
                    }
                    goto LAB_00127ba3;
                  }
                  bVar10 = Dictionary::isCompatible(local_a0,(Dictionary *)local_c8._0_8_);
                  if (!bVar10) {
                    pwVar24 = &this->what_;
                    std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) +
                                    (int)pwVar24);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pwVar24,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                               ,0x6f);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar24,"(",1);
                    poVar14 = (ostream *)std::ostream::operator<<((ostream *)pwVar24,0x82);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"sysdic->isCompatible(*d)",0x18);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"incompatible dictionary: ",0x19);
                    pcVar28 = (char *)puVar16[lVar29];
                    if (pcVar28 == (char *)0x0) {
                      std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18))
                      ;
                    }
                    else {
                      sVar17 = strlen(pcVar28);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar28,sVar17);
                    }
                    goto LAB_00127ba3;
                  }
                  iVar5._M_current =
                       (this->dic_).
                       super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar5._M_current ==
                      (this->dic_).
                      super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<MeCab::Dictionary*,std::allocator<MeCab::Dictionary*>>::
                    _M_realloc_insert<MeCab::Dictionary*const&>
                              (local_60,iVar5,(Dictionary **)local_c8);
                  }
                  else {
                    *iVar5._M_current = (Dictionary *)local_c8._0_8_;
                    pppDVar1 = &(this->dic_).
                                super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    *pppDVar1 = *pppDVar1 + 1;
                  }
                  lVar29 = lVar29 + 1;
                } while (lVar31 != lVar29);
              }
            }
            operator_delete__(puVar16);
            operator_delete__(pcVar15);
          }
          this->dictionary_info_ = (DictionaryInfo *)0x0;
          (this->dictionary_info_freelist_).pi_ = 0;
          (this->dictionary_info_freelist_).li_ = 0;
          uVar13 = (int)((ulong)((long)(this->dic_).
                                       super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->dic_).
                                      super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
          if (-1 < (int)uVar13) {
            lVar31 = (ulong)uVar13 + 1;
            do {
              pmVar20 = FreeList<mecab_dictionary_info_t>::alloc(&this->dictionary_info_freelist_);
              pmVar20->next = this->dictionary_info_;
              ppDVar6 = (this->dic_).
                        super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pmVar20->filename = (ppDVar6[lVar31 + -1]->filename_)._M_dataplus._M_p;
              pmVar20->charset = ppDVar6[lVar31 + -1]->charset_;
              pDVar19 = ppDVar6[lVar31 + -1];
              uVar13 = pDVar19->type_;
              uVar8 = pDVar19->lsize_;
              uVar9 = pDVar19->rsize_;
              pmVar20->size = pDVar19->lexsize_;
              pmVar20->type = uVar13;
              pmVar20->lsize = uVar8;
              pmVar20->rsize = uVar9;
              pmVar20->version = (unsigned_short)pDVar19->version_;
              this->dictionary_info_ = pmVar20;
              lVar29 = lVar31 + -1;
              bVar10 = 0 < lVar31;
              lVar31 = lVar29;
            } while (lVar29 != 0 && bVar10);
          }
          ppVar7 = (this->unk_tokens_).
                   super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->unk_tokens_).
              super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != ppVar7) {
            (this->unk_tokens_).
            super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar7;
          }
          uVar27 = 0;
LAB_001275f3:
          sVar21 = CharProperty::size(local_88);
          if (uVar27 < sVar21) {
            pcVar15 = CharProperty::name(local_88,uVar27);
            rVar32 = Dictionary::exactMatchSearch(local_58,pcVar15);
            if (rVar32.value != -1) goto code_r0x0012762b;
            pwVar24 = &this->what_;
            std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar24);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pwVar24,
                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                       ,0x6f);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar24,"(",1);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)pwVar24,0x9b);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"n.value != -1",0xd);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"cannot find UNK category: ",0x1a);
            if (pcVar15 == (char *)0x0) {
              std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
            }
            else {
              sVar17 = strlen(pcVar15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar15,sVar17);
            }
LAB_00127bb5:
            iVar12 = 0;
          }
          else {
            this->space_ = (this->property_).map_[0x20];
            Param::get<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,local_a8,"bos-feature");
            scoped_string::reset_string(&this->bos_feature_,(string *)local_c8);
            if ((Dictionary *)local_c8._0_8_ != (Dictionary *)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_);
            }
            Param::get<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,local_a8,"unk-feature");
            pcVar15 = (this->unk_feature_).super_scoped_array<char>.ptr_;
            if (pcVar15 != (char *)0x0) {
              operator_delete__(pcVar15);
            }
            (this->unk_feature_).super_scoped_array<char>.ptr_ = (char *)0x0;
            if (local_c8._8_8_ != 0) {
              scoped_string::reset_string(&this->unk_feature_,(string *)local_c8);
            }
            bVar10 = *(this->bos_feature_).super_scoped_array<char>.ptr_ == '\0';
            iVar12 = (int)CONCAT71((int7)((ulong)&this->unk_tokens_ >> 8),!bVar10);
            if (bVar10) {
              pwVar24 = &this->what_;
              std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar24);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pwVar24,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                         ,0x6f);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar24,"(",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)pwVar24,0xab);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"*bos_feature_ != \'\\0\'",0x15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"bos-feature is undefined in dicrc",0x21);
            }
            else {
              uVar22 = Param::get<unsigned_long>(local_a8,"max-grouping-size");
              uVar23 = 0x18;
              if (uVar22 != 0) {
                uVar23 = uVar22;
              }
              this->max_grouping_size_ = uVar23;
            }
            if ((Dictionary *)local_c8._0_8_ != (Dictionary *)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          goto LAB_0012730e;
        }
        pwVar24 = &this->what_;
        std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pwVar24,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                   ,0x6f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar24,"(",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)pwVar24,0x71);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"sysdic->type() == 0",0x13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"not a system dictionary: ",0x19)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,local_50._M_dataplus._M_p,local_50._M_string_length);
      }
    }
  }
  iVar12 = 0;
LAB_0012730e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return iVar12;
code_r0x0012762b:
  local_c8._0_8_ = (this->unkdic_).token_ + (rVar32.value >> 8);
  local_c8._8_8_ = ZEXT18((byte)rVar32.value);
  __position._M_current =
       (this->unk_tokens_).
       super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->unk_tokens_).
      super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::pair<MeCab::Token_const*,unsigned_long>,std::allocator<std::pair<MeCab::Token_const*,unsigned_long>>>
    ::_M_realloc_insert<std::pair<MeCab::Token_const*,unsigned_long>>
              ((vector<std::pair<MeCab::Token_const*,unsigned_long>,std::allocator<std::pair<MeCab::Token_const*,unsigned_long>>>
                *)&this->unk_tokens_,__position,
               (pair<const_MeCab::Token_*,_unsigned_long> *)local_c8);
  }
  else {
    (__position._M_current)->first = (Token *)local_c8._0_8_;
    (__position._M_current)->second = local_c8._8_8_;
    pppVar3 = &(this->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar3 = *pppVar3 + 1;
  }
  uVar27 = uVar27 + 1;
  goto LAB_001275f3;
}

Assistant:

bool Tokenizer<N, P>::open(const Param &param) {
  close();

  const std::string prefix = param.template get<std::string>("dicdir");

  CHECK_FALSE(unkdic_.open(create_filename
                                 (prefix, UNK_DIC_FILE).c_str()))
      << unkdic_.what();
  CHECK_FALSE(property_.open(param)) << property_.what();

  Dictionary *sysdic = new Dictionary;

  CHECK_FALSE(sysdic->open
                    (create_filename(prefix, SYS_DIC_FILE).c_str()))
      << sysdic->what();

  CHECK_FALSE(sysdic->type() == 0)
      << "not a system dictionary: " << prefix;

  property_.set_charset(sysdic->charset());
  dic_.push_back(sysdic);

  const std::string userdic = param.template get<std::string>("userdic");
  if (!userdic.empty()) {
    scoped_fixed_array<char, BUF_SIZE> buf;
    scoped_fixed_array<char *, BUF_SIZE> dicfile;
    std::strncpy(buf.get(), userdic.c_str(), buf.size());
    const size_t n = tokenizeCSV(buf.get(), dicfile.get(), dicfile.size());
    for (size_t i = 0; i < n; ++i) {
      Dictionary *d = new Dictionary;
      CHECK_FALSE(d->open(dicfile[i])) << d->what();
      CHECK_FALSE(d->type() == 1)
          << "not a user dictionary: " << dicfile[i];
      CHECK_FALSE(sysdic->isCompatible(*d))
          << "incompatible dictionary: " << dicfile[i];
      dic_.push_back(d);
    }
  }

  dictionary_info_ = 0;
  dictionary_info_freelist_.free();
  for (int i = static_cast<int>(dic_.size() - 1); i >= 0; --i) {
    DictionaryInfo *d = dictionary_info_freelist_.alloc();
    d->next          = dictionary_info_;
    d->filename      = dic_[i]->filename();
    d->charset       = dic_[i]->charset();
    d->size          = dic_[i]->size();
    d->lsize         = dic_[i]->lsize();
    d->rsize         = dic_[i]->rsize();
    d->type          = dic_[i]->type();
    d->version       = dic_[i]->version();
    dictionary_info_ = d;
  }

  unk_tokens_.clear();
  for (size_t i = 0; i < property_.size(); ++i) {
    const char *key = property_.name(i);
    const Dictionary::result_type n = unkdic_.exactMatchSearch(key);
    CHECK_FALSE(n.value != -1) << "cannot find UNK category: " << key;
    const Token *token = unkdic_.token(n);
    size_t size = unkdic_.token_size(n);
    unk_tokens_.push_back(std::make_pair(token, size));
  }

  space_ = property_.getCharInfo(0x20);  // ad-hoc

  bos_feature_.reset_string(param.template get<std::string>("bos-feature"));

  const std::string tmp = param.template get<std::string>("unk-feature");
  unk_feature_.reset(0);
  if (!tmp.empty()) {
    unk_feature_.reset_string(tmp);
  }

  CHECK_FALSE(*bos_feature_ != '\0')
      << "bos-feature is undefined in dicrc";

  max_grouping_size_ = param.template get<size_t>("max-grouping-size");
  if (max_grouping_size_ == 0) {
    max_grouping_size_ = DEFAULT_MAX_GROUPING_SIZE;
  }

  return true;
}